

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

size_t ByteStreamToBase32(uint8_t *inBuf,size_t len,char *outBuf,size_t outLen)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  char cVar8;
  
  uVar5 = (uint)*inBuf;
  iVar3 = 8;
  uVar7 = 1;
  sVar6 = 0;
  while ((sVar2 = outLen, outLen != sVar6 && (sVar2 = sVar6, uVar7 < len || 0 < iVar3))) {
    if (iVar3 < 5) {
      if (uVar7 < len) {
        uVar5 = uVar5 << 8 | (uint)inBuf[uVar7];
        uVar7 = uVar7 + 1;
        iVar3 = iVar3 + 8;
      }
      else {
        uVar5 = uVar5 << (5U - (char)iVar3 & 0x1f);
        iVar3 = 5;
      }
    }
    iVar3 = iVar3 + -5;
    uVar4 = (int)uVar5 >> ((byte)iVar3 & 0x1f) & 0x1f;
    cVar1 = (char)uVar4;
    cVar8 = cVar1 + 'a';
    if (0x19 < uVar4) {
      cVar8 = cVar1 + '\x18';
    }
    outBuf[sVar6] = cVar8;
    sVar6 = sVar6 + 1;
  }
  return sVar2;
}

Assistant:

size_t ByteStreamToBase32 (const uint8_t * inBuf, size_t len, char * outBuf, size_t outLen)
	{
		size_t ret = 0, pos = 1;
		int bits = 8, tmp = inBuf[0];
		while (ret < outLen && (bits > 0 || pos < len))
		{
			if (bits < 5)
			{
				if (pos < len)
				{
					tmp <<= 8;
					tmp |= inBuf[pos] & 0xFF;
					pos++;
					bits += 8;
				}
				else // last byte
				{
					tmp <<= (5 - bits);
					bits = 5;
				}
			}

			bits -= 5;
			int ind = (tmp >> bits) & 0x1F;
			outBuf[ret] = (ind < 26) ? (ind + 'a') : ((ind - 26) + '2');
			ret++;
		}
		return ret;
	}